

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ast::Type::getDefaultValue(Type *this)

{
  GetDefaultVisitor *in_RSI;
  Symbol *in_RDI;
  GetDefaultVisitor visitor;
  
  Symbol::visit<slang::ast::(anonymous_namespace)::GetDefaultVisitor&>(in_RDI,in_RSI);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue Type::getDefaultValue() const {
    GetDefaultVisitor visitor;
    return visit(visitor);
}